

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.h
# Opt level: O0

ValueInfo * __thiscall
ValueInfo::CopyWithGenericStructureKind(ValueInfo *this,JitArenaAllocator *allocator)

{
  JitArenaAllocator *alloc;
  ValueInfo *this_00;
  TrackAllocData local_40;
  JitArenaAllocator *local_18;
  JitArenaAllocator *allocator_local;
  ValueInfo *this_local;
  
  local_18 = allocator;
  allocator_local = (JitArenaAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.h"
             ,0x10a);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator
                     ,&local_40);
  this_00 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x18,alloc,0x4e98c0);
  ValueInfo(this_00,this,false);
  return this_00;
}

Assistant:

ValueInfo *             CopyWithGenericStructureKind(JitArenaAllocator * allocator) const
    {
        return JitAnew(allocator, ValueInfo, *this, false);
    }